

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_windows.cpp
# Opt level: O0

void __thiscall Screen_Manager::Remove(Screen_Manager *this,Am_Drawonable *draw)

{
  Screen_Info *local_20;
  Screen_Info *curr;
  Am_Drawonable *draw_local;
  Screen_Manager *this_local;
  
  if (this->head != (Screen_Info *)0x0) {
    local_20 = this->head;
    do {
      if (draw == local_20->draw) {
        Remove(this,local_20);
        return;
      }
      local_20 = local_20->next;
    } while (local_20 != this->head);
  }
  return;
}

Assistant:

void
Screen_Manager::Remove(Am_Drawonable *draw)
{
  if (!head)
    return;

  Screen_Info *curr = head;
  do {
    if (draw == curr->draw) {
      Remove(curr);
      return;
    }
    curr = curr->next;
  } while (curr != head);
}